

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

void ncnn::copy_cut_border
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,Allocator *allocator,
               int num_threads)

{
  uint _c;
  uint uVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  int h;
  void *__src;
  int iVar5;
  void *__dest;
  int iVar6;
  ulong local_60;
  
  if (right + left == 0 && bottom + top == 0) {
    if (dst != src) {
      piVar2 = src->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = dst->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (dst->allocator == (Allocator *)0x0) {
            if (dst->data != (void *)0x0) {
              free(*(void **)((long)dst->data + -8));
            }
          }
          else {
            (**(code **)(*(long *)dst->allocator + 8))();
          }
        }
      }
      dst->data = (void *)0x0;
      dst->refcount = (int *)0x0;
      dst->elemsize = 0;
      dst->dims = 0;
      dst->w = 0;
      dst->h = 0;
      dst->c = 0;
      dst->cstep = 0;
      piVar2 = src->refcount;
      dst->data = src->data;
      dst->refcount = piVar2;
      dst->elemsize = src->elemsize;
      dst->allocator = src->allocator;
      iVar4 = src->w;
      iVar5 = src->h;
      iVar6 = src->c;
      dst->dims = src->dims;
      dst->w = iVar4;
      dst->h = iVar5;
      dst->c = iVar6;
      dst->cstep = src->cstep;
    }
  }
  else {
    iVar5 = src->w - (right + left);
    iVar4 = src->h - (bottom + top);
    if (src->dims == 3) {
      _c = src->c;
      Mat::create(dst,iVar5,iVar4,_c,src->elemsize,allocator);
      if ((dst->data != (void *)0x0) && (0 < (int)_c && (long)dst->c * dst->cstep != 0)) {
        local_60 = 0;
        do {
          iVar4 = dst->h;
          if (0 < iVar4) {
            uVar1 = dst->w;
            iVar5 = src->w;
            __dest = (void *)(dst->cstep * dst->elemsize * local_60 + (long)dst->data);
            __src = (void *)((long)src->data +
                            src->cstep * src->elemsize * local_60 + (long)(iVar5 * top) * 4 +
                            (long)left * 4);
            iVar6 = 0;
            do {
              if ((int)uVar1 < 0xc) {
                if (0 < (int)uVar1) {
                  uVar3 = 0;
                  do {
                    *(undefined4 *)((long)__dest + uVar3 * 4) =
                         *(undefined4 *)((long)__src + uVar3 * 4);
                    uVar3 = uVar3 + 1;
                  } while (uVar1 != uVar3);
                }
              }
              else {
                memcpy(__dest,__src,(ulong)uVar1 * 4);
              }
              __dest = (void *)((long)__dest + (long)(int)uVar1 * 4);
              __src = (void *)((long)__src + (long)iVar5 * 4);
              iVar6 = iVar6 + 1;
            } while (iVar6 != iVar4);
          }
          local_60 = local_60 + 1;
        } while (local_60 != _c);
      }
    }
    else if (((src->dims == 2) &&
             (Mat::create(dst,iVar5,iVar4,src->elemsize,allocator), dst->data != (void *)0x0)) &&
            ((long)dst->c * dst->cstep != 0)) {
      copy_cut_border_image(src,dst,top,left);
      return;
    }
  }
  return;
}

Assistant:

void copy_cut_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right, Allocator* allocator, int num_threads)
{
    int w = src.w - left - right;
    int h = src.h - top - bottom;
    size_t elemsize = src.elemsize;

    if (w == src.w && h == src.h)
    {
        dst = src;
        return;
    }

    if (src.dims == 2)
    {
        dst.create(w, h, elemsize, allocator);
        if (dst.empty())
            return;

        copy_cut_border_image(src, dst, top, left);
    }
    else if (src.dims == 3)
    {
        int channels = src.c;

        dst.create(w, h, channels, elemsize, allocator);
        if (dst.empty())
            return;

        // unroll image channel
        #pragma omp parallel for num_threads(num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = src.channel(q);
            Mat cutm = dst.channel(q);

            copy_cut_border_image(m, cutm, top, left);
        }
    }
}